

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O0

void combine(vector<const_char_*,_std::allocator<const_char_*>_> *in,
            vector<const_char_*,_std::allocator<const_char_*>_> *views,char *outname,bool override)

{
  ulong uVar1;
  byte bVar2;
  __type _Var3;
  int iVar4;
  int iVar5;
  MultiPartInputFile *pMVar6;
  char *pcVar7;
  Header *pHVar8;
  reference ppcVar9;
  size_type sVar10;
  reference pvVar11;
  ostream *poVar12;
  invalid_argument *this;
  string *psVar13;
  reference ppMVar14;
  size_type sVar15;
  byte in_CL;
  char *in_RDX;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RSI;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  size_t k;
  string type;
  size_t p;
  MultiPartOutputFile out;
  MultiPartOutputFile temp;
  Header h_1;
  stringstream e;
  Header h;
  int j;
  int partnum;
  bool forcepartname;
  string partname;
  string filename;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fornamecheck;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  MultiPartInputFile *infile;
  vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_> fordelete;
  vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_> inputs;
  vector<int,_std::allocator<int>_> partnums;
  int numparts;
  size_t numInputs;
  MultiPartInputFile *in_stack_fffffffffffff9e0;
  value_type *in_stack_fffffffffffff9e8;
  value_type in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  allocator<char> *in_stack_fffffffffffffa10;
  char *in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa30;
  char *in_stack_fffffffffffffa48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa50;
  int *in_stack_fffffffffffffa78;
  bool *in_stack_fffffffffffffa80;
  string *in_stack_fffffffffffffa88;
  string *in_stack_fffffffffffffa90;
  size_type local_3f8;
  string local_3f0 [32];
  ulong local_3d0;
  MultiPartOutputFile local_3c8 [16];
  MultiPartOutputFile local_3b8 [47];
  allocator<char> local_389;
  string local_388 [32];
  Header local_368 [24];
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_fffffffffffffcb0;
  string local_328 [32];
  stringstream local_308 [16];
  ostream local_2f8 [383];
  allocator<char> local_179;
  string local_178 [32];
  Header local_158 [60];
  int local_11c;
  int local_118;
  byte local_111;
  string local_110 [55];
  allocator<char> local_d9;
  string local_d8 [32];
  ulong local_b8;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_98;
  MultiPartInputFile *local_80;
  vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_> local_78;
  vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  int local_2c;
  size_type local_28;
  byte local_19;
  char *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_28 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RDI);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x109774);
  std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::vector
            ((vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
              *)0x109781);
  std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::vector
            ((vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
              *)0x10978e);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x10979b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1097a8);
  local_b8 = 0;
  do {
    if (local_28 <= local_b8) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      filename_check(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff9f0);
      if (1 < local_28) {
        make_unique_names(in_stack_fffffffffffffcb0);
      }
      pcVar7 = local_18;
      pvVar11 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                          (&local_98,0);
      sVar10 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size(&local_98);
      bVar2 = local_19;
      iVar4 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                (local_3b8,pcVar7,pvVar11,(int)sVar10,(bool)(bVar2 & 1),iVar4);
      pvVar11 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                          (&local_98,0);
      sVar10 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size(&local_98);
      bVar2 = local_19;
      iVar4 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                (local_3c8,local_18,pvVar11,(int)sVar10,(bool)(bVar2 & 1),iVar4);
      for (local_3d0 = 0; uVar1 = local_3d0,
          sVar10 = std::vector<int,_std::allocator<int>_>::size(&local_48), uVar1 < sVar10;
          local_3d0 = local_3d0 + 1) {
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                  (&local_98,local_3d0);
        psVar13 = (string *)Imf_3_4::Header::type_abi_cxx11_();
        std::__cxx11::string::string(local_3f0,psVar13);
        _Var3 = std::operator==(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
        if (_Var3) {
          poVar12 = std::operator<<((ostream *)&std::cout,"part ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_3d0);
          poVar12 = std::operator<<(poVar12,": ");
          poVar12 = std::operator<<(poVar12,"scanlineimage");
          std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
          ::operator[](&local_60,local_3d0);
          std::vector<int,_std::allocator<int>_>::operator[](&local_48,local_3d0);
          copy_scanline(in_stack_fffffffffffff9f0,(MultiPartOutputFile *)in_stack_fffffffffffff9e8,
                        (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                        (int)in_stack_fffffffffffff9e0);
        }
        else {
          _Var3 = std::operator==(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
          if (_Var3) {
            poVar12 = std::operator<<((ostream *)&std::cout,"part ");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_3d0);
            poVar12 = std::operator<<(poVar12,": ");
            poVar12 = std::operator<<(poVar12,"tiledimage");
            std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
            std::
            vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
            operator[](&local_60,local_3d0);
            std::vector<int,_std::allocator<int>_>::operator[](&local_48,local_3d0);
            copy_tile(in_stack_fffffffffffff9f0,(MultiPartOutputFile *)in_stack_fffffffffffff9e8,
                      (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),(int)in_stack_fffffffffffff9e0
                     );
          }
          else {
            _Var3 = std::operator==(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
            if (_Var3) {
              poVar12 = std::operator<<((ostream *)&std::cout,"part ");
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_3d0);
              poVar12 = std::operator<<(poVar12,": ");
              poVar12 = std::operator<<(poVar12,"deepscanlineimage");
              std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
              std::
              vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
              ::operator[](&local_60,local_3d0);
              std::vector<int,_std::allocator<int>_>::operator[](&local_48,local_3d0);
              copy_scanlinedeep(in_stack_fffffffffffff9f0,
                                (MultiPartOutputFile *)in_stack_fffffffffffff9e8,
                                (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                                (int)in_stack_fffffffffffff9e0);
            }
            else {
              _Var3 = std::operator==(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
              if (_Var3) {
                poVar12 = std::operator<<((ostream *)&std::cout,"part ");
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_3d0);
                poVar12 = std::operator<<(poVar12,": ");
                poVar12 = std::operator<<(poVar12,"deeptile");
                std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
                ppMVar14 = std::
                           vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                           ::operator[](&local_60,local_3d0);
                in_stack_fffffffffffffa00 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppMVar14;
                std::vector<int,_std::allocator<int>_>::operator[](&local_48,local_3d0);
                copy_tiledeep(in_stack_fffffffffffff9f0,
                              (MultiPartOutputFile *)in_stack_fffffffffffff9e8,
                              (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                              (int)in_stack_fffffffffffff9e0);
              }
            }
          }
        }
        std::__cxx11::string::~string(local_3f0);
      }
      local_3f8 = 0;
      while (sVar10 = local_3f8,
            sVar15 = std::
                     vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                     ::size(&local_78), sVar10 < sVar15) {
        ppMVar14 = std::
                   vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                   ::operator[](&local_78,local_3f8);
        in_stack_fffffffffffff9f0 = *ppMVar14;
        if (in_stack_fffffffffffff9f0 != (value_type)0x0) {
          Imf_3_4::MultiPartInputFile::~MultiPartInputFile(in_stack_fffffffffffff9e0);
          operator_delete(in_stack_fffffffffffff9f0,0x20);
        }
        local_3f8 = local_3f8 + 1;
      }
      std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      clear((vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_> *
            )0x10a870);
      poVar12 = std::operator<<((ostream *)&std::cout,"\n");
      poVar12 = std::operator<<(poVar12,"Combine Success");
      std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(local_3c8);
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(local_3b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff9f0);
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
                ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                 in_stack_fffffffffffff9f0);
      std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      ~vector((vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
               *)in_stack_fffffffffffff9f0);
      std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      ~vector((vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
               *)in_stack_fffffffffffff9f0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9f0);
      return;
    }
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RDI,local_b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    std::allocator<char>::~allocator(&local_d9);
    std::__cxx11::string::string(local_110);
    parse_filename(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                   in_stack_fffffffffffffa78);
    if (local_118 == -1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      pMVar6 = (MultiPartInputFile *)operator_new(0x20);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iVar4 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartInputFile::MultiPartInputFile(pMVar6,pcVar7,iVar4,true);
      local_80 = pMVar6;
      std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      push_back((vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                 *)in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
      local_2c = Imf_3_4::MultiPartInputFile::parts();
      for (local_11c = 0; local_11c < local_2c; local_11c = local_11c + 1) {
        std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
        push_back((vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                   *)in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
        pHVar8 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_80);
        Imf_3_4::Header::Header(local_158,pHVar8);
        bVar2 = Imf_3_4::Header::hasName();
        if (((bVar2 & 1) == 0) || ((local_111 & 1) != 0)) {
          Imf_3_4::Header::setName((string *)local_158);
        }
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                  ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                   in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
        ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (in_RSI,local_b8);
        if (*ppcVar9 != (value_type)0x0) {
          sVar10 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size(&local_98);
          pvVar11 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                              (&local_98,sVar10 - 1);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RSI,local_b8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
          Imf_3_4::Header::setView((string *)pvVar11);
          std::__cxx11::string::~string(local_178);
          std::allocator<char>::~allocator(&local_179);
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9f0,
                   (value_type_conflict1 *)in_stack_fffffffffffff9e8);
        Imf_3_4::Header::~Header(local_158);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      pMVar6 = (MultiPartInputFile *)operator_new(0x20);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iVar4 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartInputFile::MultiPartInputFile(pMVar6,pcVar7,iVar4,true);
      local_80 = pMVar6;
      std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      push_back((vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                 *)in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
      iVar4 = local_118;
      iVar5 = Imf_3_4::MultiPartInputFile::parts();
      if (iVar5 <= iVar4) {
        std::__cxx11::stringstream::stringstream(local_308);
        poVar12 = std::operator<<(local_2f8,"You asked for part ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_118);
        poVar12 = std::operator<<(poVar12," in ");
        ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (in_RDI,local_b8);
        poVar12 = std::operator<<(poVar12,*ppcVar9);
        poVar12 = std::operator<<(poVar12,", which only has ");
        iVar4 = Imf_3_4::MultiPartInputFile::parts();
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar4);
        std::operator<<(poVar12," parts");
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::invalid_argument::invalid_argument(this,local_328);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      push_back((vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                 *)in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
      pHVar8 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_80);
      Imf_3_4::Header::Header(local_368,pHVar8);
      bVar2 = Imf_3_4::Header::hasName();
      if (((bVar2 & 1) == 0) || ((local_111 & 1) != 0)) {
        Imf_3_4::Header::setName((string *)local_368);
      }
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                 in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
      ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (in_RSI,local_b8);
      if (*ppcVar9 != (value_type)0x0) {
        sVar10 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size(&local_98);
        pvVar11 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                            (&local_98,sVar10 - 1);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RSI,local_b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
        Imf_3_4::Header::setView((string *)pvVar11);
        std::__cxx11::string::~string(local_388);
        std::allocator<char>::~allocator(&local_389);
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9f0,
                 (value_type_conflict1 *)in_stack_fffffffffffff9e8);
      Imf_3_4::Header::~Header(local_368);
    }
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_d8);
    local_b8 = local_b8 + 1;
  } while( true );
}

Assistant:

void
combine (
    vector<const char*> in,
    vector<const char*> views,
    const char*         outname,
    bool                override)
{
    size_t                      numInputs = in.size ();
    int                         numparts;
    vector<int>                 partnums;
    vector<MultiPartInputFile*> inputs;
    vector<MultiPartInputFile*> fordelete;
    MultiPartInputFile*         infile;
    vector<Header>              headers;
    vector<string>              fornamecheck;

    //
    // parse all inputs
    //

    // Input format :
    // We support the following syntax for each input
    // <file>[:<partnum>][::<newpartname>]

    for (size_t i = 0; i < numInputs; i++)
    {
        string filename (in[i]);
        string partname;
        bool   forcepartname;
        int    partnum;
        parse_filename (filename, partname, forcepartname, partnum);

        if (partnum == -1)
        {
            fornamecheck.push_back (filename);

            infile = new MultiPartInputFile (filename.c_str ());
            fordelete.push_back (infile);
            numparts = infile->parts ();

            //copy header from all parts of input to our header array
            for (int j = 0; j < numparts; j++)
            {
                inputs.push_back (infile);

                Header h = infile->header (j);
                if (!h.hasName () || forcepartname) h.setName (partname);

                headers.push_back (h);

                if (views[i] != NULL)
                    headers[headers.size () - 1].setView (views[i]);

                partnums.push_back (j);
            }
        } // no user parts specified
        else
        {
            fornamecheck.push_back (filename);

            infile = new MultiPartInputFile (filename.c_str ());
            fordelete.push_back (infile);

            if (partnum >= infile->parts ())
            {
                std::stringstream e;
                e << "You asked for part " << partnum << " in " << in[i]
                  << ", which only has " << infile->parts () << " parts";
                throw invalid_argument (e.str ());
            }
            //copy header from required part of input to our header array
            inputs.push_back (infile);

            Header h = infile->header (partnum);
            if (!h.hasName () || forcepartname) h.setName (partname);

            headers.push_back (h);

            if (views[i] != NULL)
                headers[headers.size () - 1].setView (views[i]);

            partnums.push_back (partnum);
        } // user parts specified
    }

    filename_check (fornamecheck, outname);
    //
    // sort out names - make unique
    //
    if (numInputs > 1) { make_unique_names (headers); }

    //
    // do combine
    //

    // early bail if need be
    MultiPartOutputFile temp (outname, &headers[0], headers.size (), override);

    MultiPartOutputFile out (outname, &headers[0], headers.size (), override);

    for (size_t p = 0; p < partnums.size (); p++)
    {
        std::string type = headers[p].type ();
        if (type == SCANLINEIMAGE)
        {
            cout << "part " << p << ": "
                 << "scanlineimage" << endl;
            copy_scanline (*inputs[p], out, partnums[p], p);
        }
        else if (type == TILEDIMAGE)
        {
            cout << "part " << p << ": "
                 << "tiledimage" << endl;
            copy_tile (*inputs[p], out, partnums[p], p);
        }
        else if (type == DEEPSCANLINE)
        {
            cout << "part " << p << ": "
                 << "deepscanlineimage" << endl;
            copy_scanlinedeep (*inputs[p], out, partnums[p], p);
        }
        else if (type == DEEPTILE)
        {
            cout << "part " << p << ": "
                 << "deeptile" << endl;
            copy_tiledeep (*inputs[p], out, partnums[p], p);
        }
    }

    for (size_t k = 0; k < fordelete.size (); k++)
    {
        delete fordelete[k];
    }

    inputs.clear ();

    cout << "\n"
         << "Combine Success" << endl;
}